

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

void __thiscall
YAML::detail::node_data::insert(node_data *this,node *key,node *value,shared_memory_holder *pMemory)

{
  value vVar1;
  BadSubscript *this_00;
  
  vVar1 = this->m_type;
  if ((vVar1 < Scalar) || (vVar1 == Sequence)) {
    convert_to_map(this,pMemory);
  }
  else if (vVar1 == Scalar) {
    this_00 = (BadSubscript *)__cxa_allocate_exception(0x40);
    BadSubscript::BadSubscript<YAML::detail::node>(this_00,&this->m_mark,key);
    __cxa_throw(this_00,&BadSubscript::typeinfo,BadConversion::~BadConversion);
  }
  insert_map_pair(this,key,value);
  return;
}

Assistant:

void node_data::insert(node& key, node& value,
                       const shared_memory_holder& pMemory) {
  switch (m_type) {
    case NodeType::Map:
      break;
    case NodeType::Undefined:
    case NodeType::Null:
    case NodeType::Sequence:
      convert_to_map(pMemory);
      break;
    case NodeType::Scalar:
      throw BadSubscript(m_mark, key);
  }

  insert_map_pair(key, value);
}